

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadOpcode(BinaryReader *this,Opcode *out_value,char *desc)

{
  uint8_t prefix;
  Result RVar1;
  Opcode OVar2;
  Enum EVar3;
  uint8_t value;
  uint32_t code;
  
  value = '\0';
  RVar1 = ReadU8(this,&value,desc);
  prefix = value;
  EVar3 = Error;
  if (RVar1.enum_ != Error) {
    if ((byte)(value + 4) < 3) {
      RVar1 = ReadU32Leb128(this,&code,desc);
      if (RVar1.enum_ == Error) {
        return (Result)Error;
      }
      OVar2 = Opcode::FromCode(prefix,code);
    }
    else {
      OVar2 = Opcode::FromCode((uint)value);
    }
    out_value->enum_ = (Enum)OVar2;
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReader::ReadOpcode(Opcode* out_value, const char* desc) {
  uint8_t value = 0;
  CHECK_RESULT(ReadU8(&value, desc));

  if (Opcode::IsPrefixByte(value)) {
    uint32_t code;
    CHECK_RESULT(ReadU32Leb128(&code, desc));
    *out_value = Opcode::FromCode(value, code);
  } else {
    *out_value = Opcode::FromCode(value);
  }
  return Result::Ok;
}